

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect.cc
# Opt level: O0

void __thiscall S2LatLngRect::Encode(S2LatLngRect *this,Encoder *encoder)

{
  double dVar1;
  Encoder *encoder_local;
  S2LatLngRect *this_local;
  
  Encoder::Ensure(encoder,0x28);
  Encoder::put8(encoder,'\x01');
  dVar1 = R1Interval::lo(&this->lat_);
  Encoder::putdouble(encoder,dVar1);
  dVar1 = R1Interval::hi(&this->lat_);
  Encoder::putdouble(encoder,dVar1);
  dVar1 = S1Interval::lo(&this->lng_);
  Encoder::putdouble(encoder,dVar1);
  dVar1 = S1Interval::hi(&this->lng_);
  Encoder::putdouble(encoder,dVar1);
  Encoder::avail(encoder);
  return;
}

Assistant:

void S2LatLngRect::Encode(Encoder* encoder) const {
  encoder->Ensure(40);  // sufficient

  encoder->put8(kCurrentLosslessEncodingVersionNumber);
  encoder->putdouble(lat_.lo());
  encoder->putdouble(lat_.hi());
  encoder->putdouble(lng_.lo());
  encoder->putdouble(lng_.hi());

  S2_DCHECK_GE(encoder->avail(), 0);
}